

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rotate_bspline.h
# Opt level: O0

bool __thiscall
Rotate_BSpline_Segment::intersect(Rotate_BSpline_Segment *this,Ray *ray,Hit *h,float tmin)

{
  float fVar1;
  float fVar2;
  bool bVar3;
  float *pfVar4;
  size_type sVar5;
  reference pvVar6;
  reference pdVar7;
  vector<double,_std::allocator<double>_> *b_00;
  undefined8 *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  long *in_RDI;
  float in_XMM0_Da;
  float fVar8;
  double dVar9;
  vector<double,_std::allocator<double>_> *this_00;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  Vector3f pxx_1;
  Vector3f pyy_1;
  Vector3f pos_1;
  double l_1;
  Vector3f f_3;
  double gx_1;
  double g_1;
  double u_4;
  iterator __end1_3;
  iterator __begin1_3;
  vector<double,_std::allocator<double>_> *__range1_3;
  bool suc;
  vector<double,_std::allocator<double>_> oo;
  vector<double,_std::allocator<double>_> f;
  double *u_3;
  iterator __end1_2;
  iterator __begin1_2;
  vector<double,_std::allocator<double>_> *__range1_2;
  double *u_2;
  iterator __end1_1;
  iterator __begin1_1;
  vector<double,_std::allocator<double>_> *__range1_1;
  vector<double,_std::allocator<double>_> z;
  vector<double,_std::allocator<double>_> x;
  double *u_1;
  iterator __end1;
  iterator __begin1;
  vector<double,_std::allocator<double>_> *__range1;
  vector<double,_std::allocator<double>_> t;
  float k1;
  float b1;
  Vector3f pxx;
  Vector3f pyy;
  Vector3f pos;
  double l;
  Vector3f f_2;
  double gx;
  double g;
  iterator __end3;
  iterator __begin3;
  vector<double,_std::allocator<double>_> *__range3;
  double dt;
  vector<double,_std::allocator<double>_> og;
  double C;
  double B;
  double A;
  double b;
  double b2;
  double k2;
  double b1_1;
  double k1_1;
  double u;
  iterator __end2;
  iterator __begin2;
  vector<double,_std::allocator<double>_> *__range2;
  bool suc_1;
  vector<double,_std::allocator<double>_> oo_1;
  vector<double,_std::allocator<double>_> f_1;
  undefined4 in_stack_fffffffffffff9a8;
  float in_stack_fffffffffffff9ac;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff9b0;
  Vector3f *in_stack_fffffffffffff9b8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff9c0;
  undefined4 in_stack_fffffffffffff9c8;
  float in_stack_fffffffffffff9cc;
  Vector3f *in_stack_fffffffffffff9d0;
  undefined4 in_stack_fffffffffffff9d8;
  float in_stack_fffffffffffff9dc;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff9e0;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff9f8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffa00;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffa28;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffa40;
  undefined4 in_stack_fffffffffffffa48;
  undefined4 in_stack_fffffffffffffa4c;
  undefined8 in_stack_fffffffffffffa98;
  Ray *in_stack_fffffffffffffaa0;
  BoundingBox *in_stack_fffffffffffffaa8;
  Vector3f local_4f8 [2];
  Vector3f local_4e0;
  double in_stack_fffffffffffffb30;
  double in_stack_fffffffffffffb38;
  double in_stack_fffffffffffffb40;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffb48;
  Vector3f local_49c;
  double local_490;
  double local_488;
  double local_480;
  double *local_478;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_470;
  undefined1 *local_468;
  byte local_459;
  undefined1 local_440 [292];
  Vector3f local_31c;
  double *local_310;
  double *local_308;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_300;
  vector<double,_std::allocator<double>_> *local_2f8;
  Vector3f local_2ec;
  double *local_2e0;
  double *local_2d8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_2d0;
  vector<double,_std::allocator<double>_> *local_2c8;
  vector<double,_std::allocator<double>_> local_2c0;
  vector<double,_std::allocator<double>_> local_2a8;
  reference local_290;
  double *local_288;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_280;
  vector<double,_std::allocator<double>_> *local_278;
  undefined8 local_270;
  vector<double,_std::allocator<double>_> local_268;
  float local_24c;
  Vector3f local_23c;
  float local_230;
  Vector3f local_1f0 [2];
  Vector3f local_1d8 [3];
  Vector3f local_1b4;
  ulong local_1a8;
  Vector3f local_194;
  double local_188;
  double local_180;
  double *local_178;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_170;
  undefined1 *local_168;
  double local_160;
  double local_158;
  double local_150;
  undefined1 local_148 [24];
  double local_130;
  double local_128;
  double local_120;
  double local_118;
  Vector3f local_10c;
  double local_100;
  double local_f8;
  Vector3f local_ec;
  double local_e0;
  double local_d8;
  double local_d0;
  double *local_c8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_c0;
  undefined1 *local_b8;
  byte local_a9;
  undefined1 local_90 [24];
  Vector3f local_78 [2];
  undefined8 local_60;
  vector<double,_std::allocator<double>_> local_58;
  undefined1 local_3c [24];
  float local_24;
  undefined8 *local_20;
  vector<double,_std::allocator<double>_> *local_18;
  byte local_1;
  
  local_24 = in_XMM0_Da;
  local_20 = in_RDX;
  local_18 = in_RSI;
  (**(code **)(*in_RDI + 8))(local_3c);
  bVar3 = BoundingBox::intersect
                    (in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0,
                     (float)((ulong)in_stack_fffffffffffffa98 >> 0x20),
                     (float)in_stack_fffffffffffffa98);
  if (((bVar3 ^ 0xffU) & 1) == 0) {
    pfVar4 = Vector3f::operator[]
                       ((Vector3f *)
                        ((long)&(local_18->super__Vector_base<double,_std::allocator<double>_>).
                                _M_impl.super__Vector_impl_data._M_finish + 4),1);
    dVar9 = std::fabs((double)(ulong)(uint)*pfVar4);
    if (1e-05 <= SUB84(dVar9,0)) {
      ::operator-(in_stack_fffffffffffff9b8);
      ::operator+((Vector3f *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
                  in_stack_fffffffffffff9d0);
      pfVar4 = Vector3f::operator[](&local_23c,1);
      local_230 = *pfVar4;
      pfVar4 = Vector3f::operator[]
                         ((Vector3f *)
                          ((long)&(local_18->super__Vector_base<double,_std::allocator<double>_>).
                                  _M_impl.super__Vector_impl_data._M_finish + 4),1);
      local_24c = 1.0 / *pfVar4;
      std::vector<double,_std::allocator<double>_>::vector
                (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
      sVar5 = std::vector<double,_std::allocator<double>_>::size(&local_268);
      if (sVar5 == 0) {
        local_270 = 0;
        std::vector<double,_std::allocator<double>_>::push_back
                  (in_stack_fffffffffffff9b0,
                   (value_type_conflict3 *)
                   CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
      }
      dVar9 = (double)local_230;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&local_268,0);
      *pvVar6 = dVar9 + *pvVar6;
      local_278 = &local_268;
      local_280._M_current =
           (double *)
           std::vector<double,_std::allocator<double>_>::begin
                     ((vector<double,_std::allocator<double>_> *)
                      CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
      local_288 = (double *)
                  std::vector<double,_std::allocator<double>_>::end
                            ((vector<double,_std::allocator<double>_> *)
                             CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
      while (bVar3 = __gnu_cxx::operator!=
                               ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                 *)in_stack_fffffffffffff9b0,
                                (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                 *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8)),
            bVar3) {
        local_290 = __gnu_cxx::
                    __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                    operator*(&local_280);
        *local_290 = (double)local_24c * *local_290;
        __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
        operator++(&local_280);
      }
      std::vector<double,_std::allocator<double>_>::vector
                (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
      std::vector<double,_std::allocator<double>_>::vector
                (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
      local_2c8 = &local_2a8;
      local_2d0._M_current =
           (double *)
           std::vector<double,_std::allocator<double>_>::begin
                     ((vector<double,_std::allocator<double>_> *)
                      CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
      local_2d8 = (double *)
                  std::vector<double,_std::allocator<double>_>::end
                            ((vector<double,_std::allocator<double>_> *)
                             CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
      while (bVar3 = __gnu_cxx::operator!=
                               ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                 *)in_stack_fffffffffffff9b0,
                                (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                 *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8)),
            bVar3) {
        local_2e0 = __gnu_cxx::
                    __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                    operator*(&local_2d0);
        in_stack_fffffffffffffa28 =
             (vector<double,_std::allocator<double>_> *)
             Vector3f::operator[]
                       ((Vector3f *)
                        ((long)&(local_18->super__Vector_base<double,_std::allocator<double>_>).
                                _M_impl.super__Vector_impl_data._M_finish + 4),0);
        *local_2e0 = (double)*(float *)&(in_stack_fffffffffffffa28->
                                        super__Vector_base<double,_std::allocator<double>_>)._M_impl
                                        .super__Vector_impl_data._M_start * *local_2e0;
        __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
        operator++(&local_2d0);
      }
      ::operator-((Vector3f *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
                  in_stack_fffffffffffff9d0);
      b_00 = (vector<double,_std::allocator<double>_> *)Vector3f::operator[](&local_2ec,0);
      fVar8 = *(float *)&(b_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&local_2a8,0);
      *pvVar6 = (double)fVar8 + *pvVar6;
      local_2f8 = &local_2c0;
      local_300._M_current =
           (double *)
           std::vector<double,_std::allocator<double>_>::begin
                     ((vector<double,_std::allocator<double>_> *)
                      CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
      local_308 = (double *)
                  std::vector<double,_std::allocator<double>_>::end
                            ((vector<double,_std::allocator<double>_> *)
                             CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
      while (bVar3 = __gnu_cxx::operator!=
                               ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                 *)in_stack_fffffffffffff9b0,
                                (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                 *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8)),
            bVar3) {
        local_310 = __gnu_cxx::
                    __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                    operator*(&local_300);
        pfVar4 = Vector3f::operator[]
                           ((Vector3f *)
                            ((long)&(local_18->super__Vector_base<double,_std::allocator<double>_>).
                                    _M_impl.super__Vector_impl_data._M_finish + 4),2);
        *local_310 = (double)*pfVar4 * *local_310;
        __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
        operator++(&local_300);
      }
      ::operator-((Vector3f *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
                  in_stack_fffffffffffff9d0);
      pfVar4 = Vector3f::operator[](&local_31c,2);
      this_00 = (vector<double,_std::allocator<double>_> *)(double)*pfVar4;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&local_2c0,0);
      *pvVar6 = *pvVar6 + (double)this_00;
      std::vector<double,_std::allocator<double>_>::vector(this_00,in_stack_fffffffffffff9f8);
      std::vector<double,_std::allocator<double>_>::vector(this_00,in_stack_fffffffffffff9f8);
      poly_mul<double>(in_stack_fffffffffffffa28,b_00);
      std::vector<double,_std::allocator<double>_>::vector(this_00,in_stack_fffffffffffff9f8);
      std::vector<double,_std::allocator<double>_>::vector(this_00,in_stack_fffffffffffff9f8);
      poly_mul<double>(in_stack_fffffffffffffa28,b_00);
      poly_add<double>((vector<double,_std::allocator<double>_> *)
                       CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48),
                       in_stack_fffffffffffffa40);
      std::vector<double,_std::allocator<double>_>::vector(this_00,in_stack_fffffffffffff9f8);
      std::vector<double,_std::allocator<double>_>::vector(this_00,in_stack_fffffffffffff9f8);
      poly_mul<double>(in_stack_fffffffffffffa28,b_00);
      poly_minus<double>((vector<double,_std::allocator<double>_> *)
                         CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48),
                         in_stack_fffffffffffffa40);
      std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffff9c0);
      std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffff9c0);
      std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffff9c0);
      std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffff9c0);
      std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffff9c0);
      std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffff9c0);
      std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffff9c0);
      std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffff9c0);
      std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffff9c0);
      std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffff9c0);
      std::vector<double,_std::allocator<double>_>::vector(this_00,in_stack_fffffffffffff9f8);
      Poly_Solver::poly_solve
                (in_stack_fffffffffffffb48,in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,
                 in_stack_fffffffffffffb30);
      std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffff9c0);
      local_459 = 0;
      local_468 = local_440;
      local_470._M_current =
           (double *)
           std::vector<double,_std::allocator<double>_>::begin
                     ((vector<double,_std::allocator<double>_> *)
                      CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
      local_478 = (double *)
                  std::vector<double,_std::allocator<double>_>::end
                            ((vector<double,_std::allocator<double>_> *)
                             CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
      while (bVar3 = __gnu_cxx::operator!=
                               ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                 *)in_stack_fffffffffffff9b0,
                                (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                 *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8)),
            bVar3) {
        pdVar7 = __gnu_cxx::
                 __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                 operator*(&local_470);
        local_480 = *pdVar7;
        if (((double)in_RDI[0x11] <= local_480) && (local_480 <= (double)in_RDI[0x12])) {
          dVar9 = poly_calc(in_stack_fffffffffffff9e0,
                            (double)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8));
          local_488 = (dVar9 + (double)local_230) * (double)local_24c;
          if (((double)local_24 <= local_488) && (local_488 < (double)*(float *)(local_20 + 1))) {
            local_490 = poly_calc(in_stack_fffffffffffff9e0,
                                  (double)CONCAT44(in_stack_fffffffffffff9dc,
                                                   in_stack_fffffffffffff9d8));
            Ray::pos((Ray *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
                     (float)((ulong)in_stack_fffffffffffff9c0 >> 0x20));
            ::operator-((Vector3f *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
                        in_stack_fffffffffffff9d0);
            pfVar4 = Vector3f::operator[](&local_49c,0);
            fVar8 = *pfVar4;
            pfVar4 = Vector3f::operator[](&local_49c,0);
            in_stack_fffffffffffff9dc = *pfVar4;
            in_stack_fffffffffffff9e0 =
                 (vector<double,_std::allocator<double>_> *)Vector3f::operator[](&local_49c,2);
            in_stack_fffffffffffff9cc =
                 *(float *)&(in_stack_fffffffffffff9e0->
                            super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start;
            in_stack_fffffffffffff9d0 = (Vector3f *)Vector3f::operator[](&local_49c,2);
            auVar17 = vfmadd213ss_fma(ZEXT416((uint)in_stack_fffffffffffff9dc),ZEXT416((uint)fVar8),
                                      ZEXT416((uint)(in_stack_fffffffffffff9cc *
                                                    in_stack_fffffffffffff9d0->m_elements[0])));
            auVar16._8_8_ = 0;
            auVar16._0_8_ = local_490;
            auVar31._8_8_ = 0;
            auVar31._0_8_ = (double)auVar17._0_4_;
            auVar24._8_8_ = 0;
            auVar24._0_8_ = -local_490;
            auVar17 = vfmadd213sd_fma(auVar16,auVar24,auVar31);
            auVar17._8_8_ = 0;
            auVar25._8_8_ = 0x7fffffffffffffff;
            auVar25._0_8_ = 0x7fffffffffffffff;
            auVar17 = vpand_avx(auVar17,auVar25);
            if (auVar17._0_8_ <= 0.0001) {
              *(float *)(local_20 + 1) = (float)local_488;
              *local_20 = in_RDI;
              in_stack_fffffffffffff9c0 = local_18;
              ::operator*((Vector3f *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
                          (float)((ulong)local_18 >> 0x20));
              ::operator+((Vector3f *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
                          in_stack_fffffffffffff9d0);
              ::operator-((Vector3f *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
                          in_stack_fffffffffffff9d0);
              Vector3f::Vector3f(&local_4e0,0.0,1.0,0.0);
              pfVar4 = Vector3f::operator[]((Vector3f *)&stack0xfffffffffffffb44,0);
              in_stack_fffffffffffff9ac = *pfVar4;
              in_stack_fffffffffffff9b0 =
                   (vector<double,_std::allocator<double>_> *)
                   Vector3f::operator[]((Vector3f *)&stack0xfffffffffffffb44,2);
              Vector3f::Vector3f(local_4f8,in_stack_fffffffffffff9ac,0.0,
                                 *(float *)&(in_stack_fffffffffffff9b0->
                                            super__Vector_base<double,_std::allocator<double>_>).
                                            _M_impl.super__Vector_impl_data._M_start);
              Vector3f::normalized
                        ((Vector3f *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
              poly_calc(in_stack_fffffffffffff9e0,
                        (double)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8));
              ::operator*((Vector3f *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
                          (float)((ulong)in_stack_fffffffffffff9c0 >> 0x20));
              poly_calc(in_stack_fffffffffffff9e0,
                        (double)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8));
              ::operator*((Vector3f *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
                          (float)((ulong)in_stack_fffffffffffff9c0 >> 0x20));
              ::operator+((Vector3f *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
                          in_stack_fffffffffffff9d0);
              Vector3f::operator=((Vector3f *)in_stack_fffffffffffff9b0,
                                  (Vector3f *)
                                  CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
              Vector3f::normalize((Vector3f *)in_stack_fffffffffffff9b0);
              Vector2f::operator=((Vector2f *)in_stack_fffffffffffff9b0,
                                  (Vector2f *)
                                  CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
              local_459 = 1;
            }
          }
        }
        __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
        operator++(&local_470);
      }
      local_1 = local_459 & 1;
      std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffff9c0);
      std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffff9c0);
      std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffff9c0);
      std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffff9c0);
      std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffff9c0);
    }
    else {
      std::vector<double,_std::allocator<double>_>::vector
                (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
      sVar5 = std::vector<double,_std::allocator<double>_>::size(&local_58);
      if (sVar5 == 0) {
        local_60 = 0;
        std::vector<double,_std::allocator<double>_>::push_back
                  (in_stack_fffffffffffff9b0,
                   (value_type_conflict3 *)
                   CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
      }
      ::operator-((Vector3f *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
                  in_stack_fffffffffffff9d0);
      pfVar4 = Vector3f::operator[](local_78,1);
      fVar8 = *pfVar4;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&local_58,0);
      *pvVar6 = *pvVar6 + (double)fVar8;
      std::vector<double,_std::allocator<double>_>::vector
                (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
      Poly_Solver::poly_solve
                (in_stack_fffffffffffffb48,in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,
                 in_stack_fffffffffffffb30);
      std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffff9c0);
      local_a9 = 0;
      local_b8 = local_90;
      local_c0._M_current =
           (double *)
           std::vector<double,_std::allocator<double>_>::begin
                     ((vector<double,_std::allocator<double>_> *)
                      CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
      local_c8 = (double *)
                 std::vector<double,_std::allocator<double>_>::end
                           ((vector<double,_std::allocator<double>_> *)
                            CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
      while (bVar3 = __gnu_cxx::operator!=
                               ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                 *)in_stack_fffffffffffff9b0,
                                (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                 *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8)),
            bVar3) {
        pdVar7 = __gnu_cxx::
                 __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                 operator*(&local_c0);
        local_d0 = *pdVar7;
        if (((double)in_RDI[0x11] <= local_d0) && (local_d0 <= (double)in_RDI[0x12])) {
          pfVar4 = Vector3f::operator[]
                             ((Vector3f *)
                              ((long)&(local_18->super__Vector_base<double,_std::allocator<double>_>
                                      )._M_impl.super__Vector_impl_data._M_finish + 4),0);
          local_d8 = (double)*pfVar4;
          ::operator-((Vector3f *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
                      in_stack_fffffffffffff9d0);
          pfVar4 = Vector3f::operator[](&local_ec,0);
          local_e0 = (double)*pfVar4;
          pfVar4 = Vector3f::operator[]
                             ((Vector3f *)
                              ((long)&(local_18->super__Vector_base<double,_std::allocator<double>_>
                                      )._M_impl.super__Vector_impl_data._M_finish + 4),2);
          local_f8 = (double)*pfVar4;
          ::operator-((Vector3f *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
                      in_stack_fffffffffffff9d0);
          pfVar4 = Vector3f::operator[](&local_10c,2);
          local_100 = (double)*pfVar4;
          local_118 = poly_calc(in_stack_fffffffffffff9e0,
                                (double)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8
                                                ));
          local_118 = -local_118 * local_118;
          auVar18._8_8_ = 0;
          auVar18._0_8_ = local_d8;
          auVar10._8_8_ = 0;
          auVar10._0_8_ = local_d8;
          auVar26._8_8_ = 0;
          auVar26._0_8_ = local_f8 * local_f8;
          auVar17 = vfmadd213sd_fma(auVar10,auVar18,auVar26);
          local_120 = auVar17._0_8_;
          auVar11._8_8_ = 0;
          auVar11._0_8_ = local_e0;
          auVar19._8_8_ = 0;
          auVar19._0_8_ = local_d8 * 2.0;
          auVar27._8_8_ = 0;
          auVar27._0_8_ = local_f8 * 2.0 * local_100;
          auVar17 = vfmadd213sd_fma(auVar11,auVar19,auVar27);
          local_128 = auVar17._0_8_;
          auVar20._8_8_ = 0;
          auVar20._0_8_ = local_e0;
          auVar12._8_8_ = 0;
          auVar12._0_8_ = local_e0;
          auVar28._8_8_ = 0;
          auVar28._0_8_ = local_100 * local_100;
          auVar17 = vfmadd213sd_fma(auVar12,auVar20,auVar28);
          local_130 = auVar17._0_8_ + local_118;
          std::vector<double,_std::allocator<double>_>::vector
                    ((vector<double,_std::allocator<double>_> *)0x2aa80d);
          auVar21._8_8_ = 0;
          auVar21._0_8_ = local_128;
          auVar13._8_8_ = 0;
          auVar13._0_8_ = local_128;
          auVar29._8_8_ = 0;
          auVar29._0_8_ = -(local_120 * 4.0 * local_130);
          auVar17 = vfmadd213sd_fma(auVar13,auVar21,auVar29);
          local_150 = auVar17._0_8_;
          if (0.0 <= local_150) {
            local_150 = sqrt(local_150);
            local_158 = (-local_128 - local_150) / (local_120 + local_120);
            std::vector<double,_std::allocator<double>_>::push_back
                      (in_stack_fffffffffffff9b0,
                       (value_type_conflict3 *)
                       CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
            local_160 = (local_150 - local_128) / (local_120 + local_120);
            std::vector<double,_std::allocator<double>_>::push_back
                      (in_stack_fffffffffffff9b0,
                       (value_type_conflict3 *)
                       CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
          }
          local_168 = local_148;
          local_170._M_current =
               (double *)
               std::vector<double,_std::allocator<double>_>::begin
                         ((vector<double,_std::allocator<double>_> *)
                          CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
          local_178 = (double *)
                      std::vector<double,_std::allocator<double>_>::end
                                ((vector<double,_std::allocator<double>_> *)
                                 CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
          while (bVar3 = __gnu_cxx::operator!=
                                   ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                     *)in_stack_fffffffffffff9b0,
                                    (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                     *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8)
                                   ), bVar3) {
            pdVar7 = __gnu_cxx::
                     __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                     operator*(&local_170);
            local_180 = *pdVar7;
            if (((double)local_24 <= local_180) && (local_180 < (double)*(float *)(local_20 + 1))) {
              local_188 = poly_calc(in_stack_fffffffffffff9e0,
                                    (double)CONCAT44(in_stack_fffffffffffff9dc,
                                                     in_stack_fffffffffffff9d8));
              Ray::pos((Ray *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
                       (float)((ulong)in_stack_fffffffffffff9c0 >> 0x20));
              ::operator-((Vector3f *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
                          in_stack_fffffffffffff9d0);
              pfVar4 = Vector3f::operator[](&local_194,0);
              fVar8 = *pfVar4;
              pfVar4 = Vector3f::operator[](&local_194,0);
              fVar1 = *pfVar4;
              pfVar4 = Vector3f::operator[](&local_194,2);
              fVar2 = *pfVar4;
              pfVar4 = Vector3f::operator[](&local_194,2);
              auVar17 = vfmadd213ss_fma(ZEXT416((uint)fVar1),ZEXT416((uint)fVar8),
                                        ZEXT416((uint)(fVar2 * *pfVar4)));
              auVar14._8_8_ = 0;
              auVar14._0_8_ = local_188;
              auVar30._8_8_ = 0;
              auVar30._0_8_ = (double)auVar17._0_4_;
              auVar22._8_8_ = 0;
              auVar22._0_8_ = -local_188;
              auVar17 = vfmadd213sd_fma(auVar14,auVar22,auVar30);
              auVar15._0_8_ = auVar17._0_8_;
              auVar15._8_8_ = 0;
              auVar23._8_8_ = 0x7fffffffffffffff;
              auVar23._0_8_ = 0x7fffffffffffffff;
              auVar17 = vpand_avx(auVar15,auVar23);
              local_1a8 = auVar15._0_8_;
              if (auVar17._0_8_ <= 0.001) {
                *(float *)(local_20 + 1) = (float)local_180;
                *local_20 = in_RDI;
                ::operator*((Vector3f *)
                            CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
                            (float)((ulong)in_stack_fffffffffffff9c0 >> 0x20));
                ::operator+((Vector3f *)
                            CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
                            in_stack_fffffffffffff9d0);
                ::operator-((Vector3f *)
                            CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
                            in_stack_fffffffffffff9d0);
                Vector3f::Vector3f(local_1d8,0.0,1.0,0.0);
                pfVar4 = Vector3f::operator[](&local_1b4,0);
                fVar8 = *pfVar4;
                pfVar4 = Vector3f::operator[](&local_1b4,2);
                Vector3f::Vector3f(local_1f0,fVar8,0.0,*pfVar4);
                Vector3f::normalized
                          ((Vector3f *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8)
                          );
                poly_calc(in_stack_fffffffffffff9e0,
                          (double)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8));
                ::operator*((Vector3f *)
                            CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
                            (float)((ulong)in_stack_fffffffffffff9c0 >> 0x20));
                poly_calc(in_stack_fffffffffffff9e0,
                          (double)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8));
                ::operator*((Vector3f *)
                            CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
                            (float)((ulong)in_stack_fffffffffffff9c0 >> 0x20));
                ::operator+((Vector3f *)
                            CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
                            in_stack_fffffffffffff9d0);
                Vector3f::operator=((Vector3f *)in_stack_fffffffffffff9b0,
                                    (Vector3f *)
                                    CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
                Vector3f::normalize((Vector3f *)in_stack_fffffffffffff9b0);
                ::operator-(in_stack_fffffffffffff9b8);
                fVar8 = Vector3f::dot((Vector3f *)in_stack_fffffffffffff9c0,
                                      in_stack_fffffffffffff9b8);
                if (fVar8 < 0.0) {
                  ::operator-(in_stack_fffffffffffff9b8);
                  Vector3f::operator=((Vector3f *)in_stack_fffffffffffff9b0,
                                      (Vector3f *)
                                      CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8))
                  ;
                }
                Vector2f::operator=((Vector2f *)in_stack_fffffffffffff9b0,
                                    (Vector2f *)
                                    CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
                local_a9 = 1;
              }
            }
            __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
            operator++(&local_170);
          }
          std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffff9c0);
        }
        __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
        operator++(&local_c0);
      }
      local_1 = local_a9 & 1;
      std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffff9c0);
      std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffff9c0);
    }
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool intersect(const Ray& ray, Hit& h, float tmin) override {
		if (!this->getBound().intersect(ray, tmin, h.t + 1e-3)) return 0;
		//(ray.o+ray.d*t-o)_y=py(u)
		//((ray.o+ray.d*t-o)_x)^2+((ray.o+ray.d*t-o)_z)^2-px(u)^2=0
		//t=(py(u)+Y(-ray.o+o))/Y(ray.d)
		if (fabs(ray.d[1]) < 1e-5) { //almost pararrel
			//py(u)=(ray.o-o)_y
			std::vector<double> f = py;
			if (!f.size()) f.push_back(0);
			f[0]+=(o - ray.o)[1];
			std::vector<double> oo = poly_solve(f, l, r, 1e-7);
			bool suc = 0;
			for (auto u : oo) {
				if (u<l || u>r) continue;
				double k1 = ray.d[0], b1 = (ray.o - o)[0], k2 = ray.d[2], b2 = (ray.o - o)[2], b=poly_calc(px,u);
				b = -b * b;
				//(k1*t+b1)^2+(k2*t+b2)^2+b=0
				double A = k1 * k1 + k2 * k2, B = 2 * k1 * b1 + 2 * k2 * b2, C = b1 * b1 + b2 * b2 + b;
				std::vector<double> og;
				double dt = B * B - 4 * A * C;
				if (dt >= 0) {
					dt = sqrt(dt);
					og.push_back((-B - dt) / (2 * A));
					og.push_back((-B + dt) / (2 * A));
				}
				for(auto g:og)
				if (g >= tmin && g < h.t) {
					double gx = poly_calc(px, u);
					Vector3f f = ray.pos(g) - o;
					double l = f[0] * f[0] + f[2] * f[2]; l -= gx * gx;
					if (fabs(l) > 1e-3) continue;
					h.t = g; h.obj = this;
					Vector3f pos = ray.o + ray.d * h.t - o,
						pyy = Vector3f(0, 1, 0),
						pxx = Vector3f(pos[0], 0, pos[2]).normalized();
//					double X = poly_calc(px, u), Y = poly_calc(py, u);
//					cerr << g << "," << u << "|" << X * X << "," << pos[0] * pos[0] + pos[2] * pos[2] << "|" << Y << "," << pos[1] << "\n";
					h.norm = pxx * poly_calc(nx, u) + pyy * poly_calc(ny, u);
					h.norm.normalize();
					if (Vector3f::dot(h.norm, -ray.d) < 0) h.norm = -h.norm;
					//todo: add pos, too lazy atm
					h.pos = Vector2f::ZERO; suc = 1;
				}
			}
			return suc;
		}
		float b1 = (-ray.o + o)[1], k1 = 1.0 / ray.d[1];
		//t=(py(u)+b1)*k1
		std::vector<double> t = py;
		if (!t.size()) t.push_back(0);
		t[0] += b1;
		for (auto& u : t) u *= k1;
		std::vector<double> x = t, z = t;
		for (auto& u : x) u *= ray.d[0];
		x[0] += (ray.o - o)[0];
		for (auto& u : z) u *= ray.d[2];
		z[0] += (ray.o - o)[2];
		std::vector<double> f = poly_minus(poly_add(poly_mul(x, x), poly_mul(z, z)), poly_mul(px, px));
		std::vector<double> oo = poly_solve(f, l, r, 1e-11);
//		std::cerr << "good!" << f.size() << "w" << oo.size() << "!";
//		for (auto c : oo) std::cerr << c << "|"<<poly_calc(px,c)<<"|"<<poly_calc(f,c)<<","; std::cerr << "\n";
		bool suc = 0;
		for (auto u : oo) {
			if (u<l || u>r) continue;
			double g = poly_calc(py, u);
			g = (g + b1) * k1;
			if (g >= tmin && g < h.t) {
				double gx = poly_calc(px, u);
				Vector3f f = ray.pos(g) - o;
				double l = f[0] * f[0] + f[2] * f[2]; l -= gx * gx;
				if (fabs(l) > 1e-4) continue;
				h.t = g; h.obj = this;
				Vector3f pos = ray.o + ray.d * h.t - o,
					pyy = Vector3f(0, 1, 0),
					pxx = Vector3f(pos[0], 0, pos[2]).normalized();
//				double X = poly_calc(px, u), Y = poly_calc(py, u);
//				cerr << g << "," << u << "|" << X * X << "," << pos[0] * pos[0] + pos[2] * pos[2] << "|" << Y << "," << pos[1] << "\n";
//				cerr<<pos[1]<<" "<<pos[0]*pos[0]+pos[2]*pos[2]<<"  "<<poly_calc(px,u)<<" "<<
				h.norm = pxx * poly_calc(nx, u) + pyy * poly_calc(ny, u);
				h.norm.normalize();
				//if (Vector3f::dot(h.norm, -ray.d)<0) h.norm = -h.norm;
				//todo: add pos, too lazy atm
				h.pos = Vector2f::ZERO; suc = 1;
			}
		}
		return suc;
	}